

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::stack
          (stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *this,Callbacks *cb)

{
  size_t *in_RSI;
  refdata *in_RDI;
  refdata *local_18;
  
  memset(in_RDI,0,0x300);
  local_18 = in_RDI;
  do {
    ReferenceResolver::refdata::refdata(local_18);
    local_18 = local_18 + 1;
  } while (local_18 != in_RDI + 0x10);
  in_RDI[0x10].type.type = (NodeType_e)in_RDI;
  in_RDI[0x10].node = 0;
  in_RDI[0x10].prev_anchor = 0x10;
  in_RDI[0x10].target = *in_RSI;
  in_RDI[0x10].parent_ref = in_RSI[1];
  in_RDI[0x10].parent_ref_sibling = in_RSI[2];
  in_RDI[0x11].type.type = in_RSI[3];
  return;
}

Assistant:

stack(Callbacks const& cb)
        : m_buf()
        , m_stack(m_buf)
        , m_size(0)
        , m_capacity(N)
        , m_callbacks(cb) {}